

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O2

hugeint_t duckdb::TryCastDecimalCInternal<duckdb::hugeint_t>
                    (duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  hugeint_t result_value;
  hugeint_t local_20;
  
  bVar1 = CastDecimalCInternal<duckdb::hugeint_t>(source,&local_20,col,row);
  if (!bVar1) {
    local_20 = FetchDefaultValue::Operation<duckdb::hugeint_t>();
  }
  return local_20;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}